

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O1

expected<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
tinyusdz::crate::CrateReader::GetFieldValuePair
          (expected<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,CrateReader *this,FieldValuePairVector *fvs,string *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer ppVar2;
  pointer __s2;
  size_t sVar3;
  size_t __n;
  size_type sVar4;
  int iVar5;
  long *plVar6;
  ulong *puVar7;
  pointer ppVar8;
  bool bVar9;
  ulong *local_90;
  ulong local_80;
  long lStack_78;
  ulong *local_70;
  undefined8 local_68;
  ulong local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ppVar8 = (fvs->
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (fvs->
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  bVar9 = ppVar8 == ppVar2;
  if (!bVar9) {
    __s2 = (name->_M_dataplus)._M_p;
    sVar3 = name->_M_string_length;
    do {
      __n = (ppVar8->first)._M_string_length;
      if ((__n == sVar3) &&
         ((__n == 0 || (iVar5 = bcmp((ppVar8->first)._M_dataplus._M_p,__s2,__n), iVar5 == 0)))) {
        (__return_storage_ptr__->contained).
        super_storage_t_impl<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .m_has_value = true;
        ::std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>
        ::pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>
                *)__return_storage_ptr__,ppVar8);
        if (!bVar9) {
          return __return_storage_ptr__;
        }
        break;
      }
      ppVar8 = ppVar8 + 1;
      bVar9 = ppVar8 == ppVar2;
    } while (!bVar9);
  }
  ::std::operator+(&local_50,"FieldValuePair not found with name: `",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)name);
  plVar6 = (long *)::std::__cxx11::string::append((char *)&local_50);
  puVar7 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar7) {
    local_80 = *puVar7;
    lStack_78 = plVar6[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *puVar7;
    local_90 = (ulong *)*plVar6;
  }
  local_60 = local_80;
  sVar4 = plVar6[1];
  *plVar6 = (long)puVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if (local_90 == &local_80) {
    lStack_58 = lStack_78;
    local_70 = &local_60;
  }
  else {
    local_70 = local_90;
  }
  local_80 = local_80 & 0xffffffffffffff00;
  (__return_storage_ptr__->contained).
  super_storage_t_impl<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .m_has_value = false;
  paVar1 = &(__return_storage_ptr__->contained).
            super_storage_t_impl<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .field_0.m_value.first.field_2;
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)&(__return_storage_ptr__->contained).
        super_storage_t_impl<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .field_0 = paVar1;
  if (local_70 == &local_60) {
    paVar1->_M_allocated_capacity = local_60;
    *(long *)((long)&(__return_storage_ptr__->contained).
                     super_storage_t_impl<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     .field_0.m_value.first.field_2 + 8) = lStack_58;
  }
  else {
    (__return_storage_ptr__->contained).
    super_storage_t_impl<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0.m_value.first._M_dataplus._M_p = (pointer)local_70;
    (__return_storage_ptr__->contained).
    super_storage_t_impl<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0.m_value.first.field_2._M_allocated_capacity = local_60;
  }
  (__return_storage_ptr__->contained).
  super_storage_t_impl<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .field_0.m_value.first._M_string_length = sVar4;
  local_60 = local_60 & 0xffffffffffffff00;
  local_68 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    local_70 = &local_60;
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::expected<FieldValuePair, std::string>
CrateReader::GetFieldValuePair(const FieldValuePairVector &fvs,
                               const std::string &name) {
  for (const auto &fv : fvs) {
    if (fv.first == name) {
      return fv;
    }
  }

  return nonstd::make_unexpected("FieldValuePair not found with name: `" +
                                 name + "`");
}